

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManOrigIdsStart(Gia_Man_t *p)

{
  Vec_Int_t *pVVar1;
  
  Vec_IntFreeP(&p->vIdsOrig);
  pVVar1 = Vec_IntStartFull(p->nObjs);
  p->vIdsOrig = pVVar1;
  return;
}

Assistant:

void Gia_ManOrigIdsStart( Gia_Man_t * p )
{
    Vec_IntFreeP( &p->vIdsOrig );
    p->vIdsOrig = Vec_IntStartFull( Gia_ManObjNum(p) );
}